

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O1

array * cs_impl::path_cs_ext::scan(array *__return_storage_ptr__,string *path)

{
  DIR *__dirp;
  dirent *pdVar1;
  long *plVar2;
  array entries;
  uint *local_a0;
  long local_98;
  uint local_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  any local_80;
  _Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_> local_78;
  
  __dirp = opendir((path->_M_dataplus)._M_p);
  if (__dirp != (DIR *)0x0) {
    local_78._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    local_78._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
    local_78._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    local_78._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    local_78._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    local_78._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    local_78._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    local_78._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    local_78._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    local_78._M_impl.super__Deque_impl_data._M_map_size = 0;
    std::_Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>::_M_initialize_map(&local_78,0);
    pdVar1 = readdir(__dirp);
    while (pdVar1 != (dirent *)0x0) {
      any::make<cs_impl::path_cs_ext::path_info,char(&)[256],unsigned_char&>
                (&local_80,&pdVar1->d_name,&pdVar1->d_type);
      std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::emplace_back<cs_impl::any>
                ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)&local_78,&local_80);
      any::recycle(&local_80);
      pdVar1 = readdir(__dirp);
    }
    closedir(__dirp);
    std::_Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>::_Deque_base
              (&__return_storage_ptr__->
                super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>,&local_78);
    std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::~deque
              ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)&local_78);
    return __return_storage_ptr__;
  }
  plVar2 = (long *)__cxa_allocate_exception(0x20);
  local_a0 = &local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"Path does not exist.","");
  *plVar2 = (long)(plVar2 + 2);
  if (local_a0 == &local_90) {
    *(uint *)(plVar2 + 2) = local_90;
    *(undefined4 *)((long)plVar2 + 0x14) = uStack_8c;
    *(undefined4 *)(plVar2 + 3) = uStack_88;
    *(undefined4 *)((long)plVar2 + 0x1c) = uStack_84;
  }
  else {
    *plVar2 = (long)local_a0;
    plVar2[2] = CONCAT44(uStack_8c,local_90);
  }
  plVar2[1] = local_98;
  local_98 = 0;
  local_90 = local_90 & 0xffffff00;
  local_a0 = &local_90;
  __cxa_throw(plVar2,&cs::lang_error::typeinfo,cs::lang_error::~lang_error);
}

Assistant:

array scan(const string &path)
		{
			DIR *dir = ::opendir(path.c_str());
			if (dir == nullptr)
				throw cs::lang_error("Path does not exist.");
			array
			entries;
			for (dirent *dp = ::readdir(dir); dp != nullptr; dp = ::readdir(dir))
				entries.push_back(var::make<path_info>(dp->d_name, dp->d_type));
			::closedir(dir);
			return std::move(entries);
		}